

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_0::Thread::testContext(Thread *this,EGLContext context)

{
  Library *egl;
  EGLDisplay display;
  deUint32 dVar1;
  int iVar2;
  undefined4 extraout_var;
  UniqueSurface surface;
  EGLint attribs [5];
  
  if (this->m_surface != (EGLSurface)0x0) {
    dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0x4b);
    (*this->m_egl->_vptr_Library[0x27])
              (this->m_egl,this->m_display,this->m_surface,this->m_surface,context);
    dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0x4d);
    return;
  }
  egl = this->m_egl;
  display = this->m_display;
  iVar2 = (*egl->_vptr_Library[10])(egl,display,this->m_config);
  eglu::UniqueSurface::UniqueSurface(&surface,egl,display,(EGLSurface)CONCAT44(extraout_var,iVar2));
  dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                   ,0x59);
  (*this->m_egl->_vptr_Library[0x27])
            (this->m_egl,this->m_display,surface.m_surface,surface.m_surface,context);
  dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                   ,0x5b);
  eglu::UniqueSurface::~UniqueSurface(&surface);
  return;
}

Assistant:

void testContext (EGLContext context)
	{
		if (m_surface != EGL_NO_SURFACE)
		{
			EGLU_CHECK_MSG(m_egl, "eglCreateContext");
			m_egl.makeCurrent(m_display, m_surface, m_surface, context);
			EGLU_CHECK_MSG(m_egl, "eglMakeCurrent");
		}
		else
		{
			const EGLint attribs[] =
			{
				EGL_WIDTH, 32,
				EGL_HEIGHT, 32,
				EGL_NONE
			};
			const eglu::UniqueSurface surface (m_egl, m_display, m_egl.createPbufferSurface(m_display, m_config, attribs));

			EGLU_CHECK_MSG(m_egl, "eglCreateContext");
			m_egl.makeCurrent(m_display, *surface, *surface, context);
			EGLU_CHECK_MSG(m_egl, "eglMakeCurrent");
		}
	}